

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool duckdb::TryCastCInternal<duckdb::interval_t,bool,duckdb::TryCast>
               (duckdb_result *result,idx_t col,idx_t row)

{
  void *pvVar1;
  bool bVar2;
  undefined8 in_RAX;
  interval_t input;
  bool result_value;
  bool local_1;
  
  local_1 = SUB81((ulong)in_RAX >> 0x38,0);
  pvVar1 = result->deprecated_columns[col].deprecated_data;
  input.micros = *(int64_t *)((long)pvVar1 + row * 0x10 + 8);
  input._0_8_ = *(undefined8 *)((long)pvVar1 + row * 0x10);
  bVar2 = TryCast::Operation<duckdb::interval_t,bool>(input,&local_1,false);
  if (!bVar2) {
    local_1 = false;
  }
  return local_1;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}